

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_digest.c
# Opt level: O3

void warn_all_untested(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ENGINE *e;
  ENGINE_DIGESTS_PTR pEVar6;
  EVP_MD *pEVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  HMAC_CTX *ctx;
  EVP_MD_CTX *pEVar11;
  ulong uVar12;
  undefined8 uVar13;
  long lVar14;
  void *ptr;
  EVP_MD_CTX *ctx_00;
  ENGINE *unaff_RBX;
  void *d;
  void *pvVar15;
  hash_testvec *phVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char **__s;
  char *pcVar20;
  size_t sVar21;
  uchar *md;
  ulong uVar22;
  size_t sVar23;
  bool bVar24;
  int *nids;
  EVP_MD *pEStack_288;
  EVP_MD *pEStack_280;
  char *pcStack_278;
  long lStack_270;
  ulong uStack_260;
  size_t sStack_258;
  hash_testvec *phStack_250;
  uchar *puStack_248;
  char *pcStack_240;
  uint uStack_238;
  uint uStack_234;
  void *pvStack_230;
  ulong uStack_228;
  ulong uStack_220;
  int *piStack_218;
  char *pcStack_210;
  long lStack_208;
  char *apcStack_200 [5];
  char *pcStack_1d8;
  undefined8 uStack_1d0;
  char *pcStack_1c8;
  char *pcStack_1c0;
  char *pcStack_1b8;
  char *apcStack_1b0 [10];
  undefined8 uStack_160;
  uint uStack_158;
  uint uStack_154;
  char *pcStack_150;
  char *pcStack_148;
  char *pcStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  ENGINE *pEStack_58;
  int *local_20;
  
  iVar1 = engine_is_available("gost");
  e = unaff_RBX;
  if (iVar1 == 0) {
LAB_001036be:
    iVar1 = OSSL_PROVIDER_available(0,"gostprov");
    if (iVar1 == 0) {
      return;
    }
    lVar8 = OSSL_PROVIDER_load(0,"gostprov");
    if (lVar8 != 0) {
      EVP_MD_do_all_provided(0,warn_if_untested,lVar8);
      OSSL_PROVIDER_unload(lVar8);
      return;
    }
  }
  else {
    e = ENGINE_by_id("gost");
    if (e == (ENGINE *)0x0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("eng = ENGINE_by_id(\"gost\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x3a3);
    }
    else {
      iVar1 = ENGINE_init(e);
      unaff_RBX = e;
      if (iVar1 != 0) {
        pEVar6 = ENGINE_get_digests(e);
        if (pEVar6 == (ENGINE_DIGESTS_PTR)0x0) goto LAB_0010377e;
        uVar2 = (*pEVar6)(e,(EVP_MD **)0x0,&local_20,0);
        if (0 < (int)uVar2) {
          uVar22 = 0;
          do {
            pEVar7 = ENGINE_get_digest(e,local_20[uVar22]);
            warn_if_untested((EVP_MD *)pEVar7,(void *)0x0);
            uVar22 = uVar22 + 1;
          } while (uVar2 != uVar22);
        }
        ENGINE_finish(e);
        ENGINE_free(e);
        goto LAB_001036be;
      }
    }
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ENGINE_init(eng)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x3a4);
    e = unaff_RBX;
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("prov = OSSL_PROVIDER_load(NULL, \"gostprov\")",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x3b3);
LAB_0010377e:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("fn_c = ENGINE_get_digests(eng)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x3a7);
  pEStack_58 = e;
  OPENSSL_init_crypto(0x4c,0);
  phVar16 = testvecs;
  pcStack_278 = "md_gost12_512";
  uStack_238 = 0;
LAB_001037f4:
  pcStack_210 = phVar16->plaintext;
  phStack_250 = phVar16;
  if (pcStack_210 == (char *)0x0) {
    printf("\x1b[1;34mTest %s: \x1b[m",phVar16->name);
    fflush(_stdout);
    lStack_270 = 0x100;
    pvVar15 = (void *)0x0;
LAB_001041f7:
    ptr = (void *)CRYPTO_zalloc((ulong)pvVar15 | 0x100,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                ,0x324);
    if (ptr != (void *)0x0) {
      lVar8 = 0;
      do {
        ((uchar *)((long)ptr + (long)pvVar15))[lVar8] = (uchar)lVar8;
        lVar8 = lVar8 + 1;
        uStack_160 = (char *)CONCAT44(uStack_160._4_4_,(int)lVar8);
      } while (lVar8 != 0x100);
      pEStack_288 = EVP_get_digestbyname(pcStack_278);
      if ((pEStack_288 != (EVP_MD *)0x0) ||
         (pEStack_288 = (EVP_MD *)EVP_MD_fetch(0,pcStack_278,0), pEStack_288 != (EVP_MD *)0x0)) {
        iVar1 = EVP_MD_is_a(pEStack_288,pcStack_278);
        if (iVar1 != 0) {
          puStack_248 = (uchar *)((long)ptr + (long)pvVar15);
          pEVar11 = (EVP_MD_CTX *)EVP_MD_CTX_new();
          if (pEVar11 != (EVP_MD_CTX *)0x0) {
            ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
            if (ctx_00 != (EVP_MD_CTX *)0x0) {
              iVar1 = EVP_DigestInit(ctx_00,pEStack_288);
              if (iVar1 != 0) {
                pEVar7 = EVP_MD_CTX_md(ctx_00);
                iVar1 = EVP_MD_is_a(pEVar7,pcStack_278);
                if (iVar1 != 0) {
                  iVar1 = EVP_MD_get_block_size(pEStack_288);
                  if (iVar1 == phVar16->block_size) {
                    uVar13 = EVP_MD_CTX_get0_md(ctx_00);
                    iVar3 = EVP_MD_get_size(uVar13);
                    sVar9 = (size_t)iVar3;
                    if (phVar16->outsize == sVar9) {
                      uVar13 = EVP_MD_CTX_get0_md(ctx_00);
                      iVar3 = EVP_MD_get_block_size(uVar13);
                      if (iVar3 == iVar1) {
                        uVar2 = EVP_MD_get_size(pEStack_288);
                        if (sVar9 == uVar2) {
                          pcVar20 = (char *)CRYPTO_zalloc(uVar2 + (int)pvVar15,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                                  ,0x33a);
                          if (pcVar20 != (char *)0x0) {
                            md = (uchar *)(pcVar20 + (long)pvVar15);
                            d = (void *)((long)ptr + lStack_270);
                            sVar21 = 0;
                            pcStack_240 = pcVar20;
                            pvStack_230 = pvVar15;
                            do {
                              iVar1 = EVP_DigestInit(pEVar11,pEStack_288);
                              if (iVar1 == 0) {
LAB_001046c7:
                                ERR_print_errors_fp(_stderr);
                                OPENSSL_die("EVP_DigestInit(ctx, dgst)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                            ,0x340);
LAB_001046ee:
                                ERR_print_errors_fp(_stderr);
                                OPENSSL_die("EVP_DigestUpdate(ctx, ibuf + shifts + SUPER_SIZE - len, len)"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                            ,0x341);
                                goto LAB_00104715;
                              }
                              iVar1 = EVP_DigestUpdate(pEVar11,d,sVar21);
                              if (iVar1 == 0) goto LAB_001046ee;
                              iVar1 = EVP_DigestFinal(pEVar11,md,(uint *)0x0);
                              if (iVar1 == 0) {
LAB_001046a0:
                                ERR_print_errors_fp(_stderr);
                                OPENSSL_die("EVP_DigestFinal(ctx, md, NULL)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                            ,0x342);
                                goto LAB_001046c7;
                              }
                              iVar1 = EVP_DigestUpdate(ctx_00,md,sVar9);
                              if (iVar1 == 0) {
                                ERR_print_errors_fp(_stderr);
                                OPENSSL_die("EVP_DigestUpdate(ctx2, md, mdlen)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                                            ,0x343);
                                goto LAB_001046a0;
                              }
                              sVar21 = sVar21 + 1;
                              d = (void *)((long)d + -1);
                            } while (sVar21 != 0x100);
                            sVar21 = 0;
                            do {
                              iVar1 = EVP_DigestInit(pEVar11,pEStack_288);
                              if (iVar1 == 0) goto LAB_0010478a;
                              iVar1 = EVP_DigestUpdate(pEVar11,puStack_248,sVar21);
                              if (iVar1 == 0) goto LAB_00104715;
                              iVar1 = EVP_DigestFinal(pEVar11,md,(uint *)0x0);
                              if (iVar1 == 0) goto LAB_0010473c;
                              iVar1 = EVP_DigestUpdate(ctx_00,md,sVar9);
                              if (iVar1 == 0) goto LAB_00104763;
                              sVar21 = sVar21 + 1;
                            } while (sVar21 != 0x100);
                            uStack_160 = (char *)CONCAT44(uStack_160._4_4_,0x100);
                            CRYPTO_free(ptr);
                            EVP_MD_CTX_free(pEVar11);
                            iVar1 = EVP_DigestFinal(ctx_00,md,(uint *)&uStack_160);
                            if (iVar1 != 0) {
                              EVP_MD_CTX_free(ctx_00);
                              EVP_MD_free(pEStack_288);
                              if ((uint)uStack_160 == uVar2) {
                                iVar1 = bcmp(md,phStack_250->digest,sVar9);
                                if (iVar1 == 0) goto code_r0x001044dc;
                                puts("\x1b[1;31mdigest mismatch\x1b[m");
                                printf("  Expected value is: ");
                                if (uVar2 != 0) {
                                  sVar21 = 0;
                                  do {
                                    printf("\\x%02x",(ulong)md[sVar21]);
                                    sVar21 = sVar21 + 1;
                                  } while (sVar9 != sVar21);
                                }
                                putchar(10);
                              }
                              else {
                                printf(
                                      "\x1b[1;31mdigest output len mismatch %u != %u (expected)\x1b[m\n"
                                      );
                              }
                              CRYPTO_free(pcStack_240);
                              EVP_MD_free(pEStack_288);
                              pcVar20 = "\x1b[1;31mfail\x1b[m";
                              goto LAB_001045fe;
                            }
                            goto LAB_00104ad8;
                          }
                          goto LAB_00104a33;
                        }
                        goto LAB_00104985;
                      }
                      goto LAB_00104ac0;
                    }
                    goto LAB_00104aa8;
                  }
                  goto LAB_0010499d;
                }
                goto LAB_00104a1b;
              }
              goto LAB_001049f4;
            }
            goto LAB_00104a81;
          }
          goto LAB_001049cd;
        }
        goto LAB_001049b5;
      }
      goto LAB_00104e32;
    }
    goto LAB_00104a5a;
  }
  ERR_set_mark();
  pEStack_280 = EVP_get_digestbyname(pcStack_278);
  if ((pEStack_280 == (EVP_MD *)0x0) &&
     (pEStack_280 = (EVP_MD *)EVP_MD_fetch(0,pcStack_278,0), pEStack_280 == (EVP_MD *)0x0)) {
    lStack_270 = EVP_MAC_fetch(0,pcStack_278,0);
    if (lStack_270 == 0) goto LAB_00104f91;
    pEStack_280 = (EVP_MD *)0x0;
  }
  else {
    lStack_270 = 0;
  }
  ERR_pop_to_mark();
  printf("\x1b[1;34mTest %s: %s: \x1b[m",pcStack_278,phVar16->name);
  sVar9 = (size_t)phVar16->psize;
  pvStack_230 = CRYPTO_malloc(phVar16->psize + 0x20,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                              ,0x2fb);
  if (pvStack_230 == (void *)0x0) goto LAB_00104f6a;
  piStack_218 = &phVar16->acpkm_t;
  uVar22 = 0;
  uStack_220 = 0;
  do {
    __s = apcStack_200;
    puStack_248 = (uchar *)((long)pvStack_230 + uVar22);
    memcpy(puStack_248,pcStack_210,sVar9);
    uVar2 = 0;
    if (lStack_270 != 0) {
      if (uVar22 == 0) {
        printf("[MAC %zu] ");
      }
      iVar1 = phVar16->acpkm;
      iVar3 = phVar16->acpkm_t;
      lStack_208 = (long)iVar3;
      sStack_258 = (long)iVar1;
      memset(__s,0,0xa0);
      if ((long)iVar1 != 0) {
        OSSL_PARAM_construct_size_t(apcStack_200,"key-mesh",&sStack_258);
        __s = &pcStack_1d8;
        if (iVar3 != 0) {
          OSSL_PARAM_construct_size_t(&uStack_160,"cipher-key-mesh",&lStack_208);
          pcStack_1b8 = pcStack_140;
          uStack_1d0 = CONCAT44(uStack_154,uStack_158);
          pcStack_1c8 = pcStack_150;
          pcStack_1c0 = pcStack_148;
          pcStack_1d8 = uStack_160;
          __s = apcStack_1b0;
        }
      }
      lVar8 = EVP_MAC_CTX_new(lStack_270);
      if (lVar8 == 0) goto LAB_001048c2;
      sVar23 = phVar16->outsize;
      if ((sVar23 != 0) && (sVar10 = EVP_MAC_CTX_get_mac_size(lVar8), sVar10 != sVar23))
      goto LAB_00104be9;
      iVar1 = phVar16->truncate;
      if ((long)iVar1 == 0) {
        uStack_260 = EVP_MAC_CTX_get_mac_size(lVar8);
      }
      else {
        uStack_260 = (long)iVar1;
        OSSL_PARAM_construct_size_t(&uStack_160,"size",&uStack_260);
        __s[4] = pcStack_140;
        __s[2] = pcStack_150;
        __s[3] = pcStack_148;
        *(uint *)__s = (uint)uStack_160;
        *(uint *)((long)__s + 4) = uStack_160._4_4_;
        *(uint *)(__s + 1) = uStack_158;
        *(uint *)((long)__s + 0xc) = uStack_154;
      }
      iVar3 = EVP_MAC_init(lVar8,phVar16->key,(long)phVar16->key_size);
      if (iVar3 == 0) goto LAB_0010495e;
      iVar3 = EVP_MAC_CTX_set_params(lVar8,apcStack_200);
      if (iVar3 == 0) goto LAB_00104937;
      iVar3 = EVP_MAC_update(lVar8,puStack_248,sVar9);
      if (iVar3 == 0) goto LAB_00104910;
      uStack_228 = 0;
      if (iVar1 == 0) {
        uVar12 = EVP_MAC_CTX_get_mac_size(lVar8);
        if (uVar12 != uStack_260) goto LAB_00104d6f;
        iVar1 = EVP_MAC_final(lVar8,&uStack_160,&uStack_228);
        if (iVar1 == 0) goto LAB_00104de4;
      }
      else {
        if (0x100 < uStack_260) goto LAB_00104c5e;
        iVar1 = EVP_MAC_finalXOF(lVar8,&uStack_160);
        if (iVar1 == 0) goto LAB_00104cd3;
        uStack_228 = uStack_260;
      }
      EVP_MAC_CTX_free(lVar8);
      uVar12 = uStack_228;
      if (uStack_228 != uStack_260) goto LAB_001048e9;
      pcVar20 = phVar16->digest;
      iVar1 = bcmp(&uStack_160,pcVar20,uStack_228);
      if (iVar1 == 0) {
        uVar2 = 0;
      }
      else {
        printf("\x1b[1;31mmac mismatch (iter %d, outsize %d)\x1b[m\n",uVar22 & 0xffffffff,
               uVar12 & 0xffffffff);
        hexdump(pcVar20,uStack_260);
        hexdump(&uStack_160,uStack_260);
        uVar2 = 1;
      }
    }
    if (pEStack_280 != (EVP_MD *)0x0) {
      pcVar20 = phVar16->hmac;
      if (pcVar20 == (char *)0x0) {
        sVar23 = phVar16->outsize;
        if (uVar22 == 0) {
          printf("[MD %zu] ",sVar23);
        }
        if ((sVar23 != 0) && (iVar1 = EVP_MD_get_size(pEStack_280), sVar23 != (long)iVar1))
        goto LAB_00104e59;
        uVar4 = phVar16->truncate;
        if (uVar4 == 0) {
          uVar4 = EVP_MD_get_size(pEStack_280);
        }
        iVar1 = phVar16->block_size;
        if ((iVar1 != 0) && (iVar3 = EVP_MD_get_block_size(pEStack_280), iVar3 != iVar1))
        goto LAB_00104e80;
        pEVar11 = (EVP_MD_CTX *)EVP_MD_CTX_new();
        if (pEVar11 == (EVP_MD_CTX *)0x0) goto LAB_00104dbd;
        iVar1 = EVP_MD_CTX_reset(pEVar11);
        if (iVar1 == 0) goto LAB_00104e0b;
        iVar1 = EVP_DigestInit_ex(pEVar11,pEStack_280,(ENGINE *)0x0);
        if (iVar1 == 0) goto LAB_00104d96;
        if ((phVar16->key != (char *)0x0) &&
           (iVar1 = EVP_MD_CTX_ctrl(pEVar11,0x1004,phVar16->key_size), iVar1 == 0))
        goto LAB_00104ea7;
        if ((phVar16->acpkm != 0) && (iVar1 = EVP_MD_CTX_ctrl(pEVar11,0x20), iVar1 == 0))
        goto LAB_00104ece;
        iVar1 = EVP_DigestUpdate(pEVar11,puStack_248,sVar9);
        if (iVar1 == 0) goto LAB_00104d21;
        sVar23 = (size_t)(int)uVar4;
        pEVar7 = EVP_MD_CTX_md(pEVar11);
        uVar12 = EVP_MD_get_flags(pEVar7);
        if ((uVar12 & 2) == 0) {
          uVar13 = EVP_MD_CTX_get0_md();
          uVar5 = EVP_MD_get_size(uVar13);
          if (uVar5 != uVar4) goto LAB_00104f1c;
          iVar1 = EVP_DigestFinal_ex(pEVar11,(uchar *)&uStack_160,(uint *)apcStack_200);
          uVar5 = (uint)apcStack_200[0];
          if (iVar1 == 0) goto LAB_00104ef5;
        }
        else {
          iVar1 = EVP_DigestFinalXOF(pEVar11,&uStack_160,sVar23);
          uVar5 = uVar4;
          if (iVar1 == 0) goto LAB_00104f43;
        }
        apcStack_200[0]._0_4_ = uVar5;
        EVP_MD_CTX_free(pEVar11);
        if ((uint)apcStack_200[0] != sVar23) goto LAB_00104d48;
        pcVar20 = phStack_250->digest;
        iVar1 = bcmp(&uStack_160,pcVar20,sVar23);
        if (iVar1 != 0) {
          printf("\x1b[1;31mdigest mismatch (iter %d, outsize %d)\x1b[m\n",uVar22 & 0xffffffff,
                 (ulong)uVar4);
          hexdump(pcVar20,sVar23);
          hexdump(&uStack_160,sVar23);
        }
        uVar2 = uVar2 | iVar1 != 0;
        phVar16 = phStack_250;
      }
      else {
        pcStack_240 = pcVar20;
        if (uVar22 == 0) {
          printf("[HMAC] ");
        }
        ctx = (HMAC_CTX *)HMAC_CTX_new();
        if (ctx == (HMAC_CTX *)0x0) goto LAB_00104bc2;
        pcVar20 = phVar16->key;
        iVar1 = phVar16->key_size;
        iVar3 = HMAC_Init_ex(ctx,pcVar20,iVar1,pEStack_280,(ENGINE *)0x0);
        if (iVar3 == 0) goto LAB_00104b9b;
        iVar3 = HMAC_Update(ctx,puStack_248,sVar9);
        if (iVar3 == 0) goto LAB_00104b74;
        iVar3 = HMAC_Final(ctx,(uchar *)&uStack_160,(uint *)apcStack_200);
        if (iVar3 == 0) goto LAB_00104b4d;
        HMAC_CTX_free(ctx);
        pcVar19 = pcStack_240;
        uVar12 = phStack_250->outsize;
        if (uVar12 != (uint)apcStack_200[0] && uVar12 != 0) goto LAB_00104c10;
        iVar3 = bcmp(&uStack_160,pcStack_240,(ulong)(uint)apcStack_200[0]);
        if (iVar3 != 0) {
          printf("\x1b[1;31mhmac mismatch (iter %d)\x1b[m\n",uVar22 & 0xffffffff);
          hexdump(pcVar19,(ulong)(uint)apcStack_200[0]);
          hexdump(&uStack_160,(ulong)(uint)apcStack_200[0]);
        }
        uStack_234 = (uint)(iVar3 != 0);
        if (uVar22 == 0) {
          printf("[HMAC by EVP_MAC] ");
        }
        lVar8 = EVP_MAC_fetch(0,"HMAC",0);
        if (lVar8 == 0) goto LAB_00104aff;
        lVar14 = EVP_MAC_CTX_new(lVar8);
        if (lVar14 == 0) goto LAB_00104b26;
        uStack_160 = "digest";
        uStack_158 = 4;
        pcStack_150 = (char *)EVP_MD_get0_name(pEStack_280);
        pcStack_148 = (char *)0x0;
        pcStack_140 = (char *)0xffffffffffffffff;
        uStack_138 = 0;
        uStack_130 = 0;
        uStack_128 = 0;
        uStack_120 = 0;
        uStack_118 = 0;
        iVar1 = EVP_MAC_init(lVar14,pcVar20,(long)iVar1,&uStack_160);
        if (iVar1 == 0) goto LAB_00104cfa;
        iVar1 = EVP_MAC_update(lVar14,puStack_248,sVar9);
        if (iVar1 == 0) goto LAB_00104cac;
        iVar1 = EVP_MAC_final(lVar14,apcStack_200,&sStack_258,0x40);
        if (iVar1 == 0) goto LAB_00104c37;
        EVP_MAC_CTX_free(lVar14);
        EVP_MAC_free(lVar8);
        pcVar20 = pcStack_240;
        if (sStack_258 != uVar12 && uVar12 != 0) goto LAB_00104c85;
        iVar1 = bcmp(apcStack_200,pcStack_240,sStack_258);
        phVar16 = phStack_250;
        if (iVar1 != 0) {
          printf("\x1b[1;31mhmac mismatch (iter %d)\x1b[m\n",uVar22 & 0xffffffff);
          hexdump(pcVar20,sStack_258);
          hexdump(apcStack_200,sStack_258);
        }
        uVar2 = uVar2 | uStack_234 | iVar1 != 0;
      }
    }
    iVar1 = OBJ_sn2nid(pcStack_278);
    pcVar20 = "kuznyechik-cbc";
    if (iVar1 == 0x3f9) {
LAB_00104015:
      if (uVar22 == 0) {
        printf("[CMAC(%s)] ",pcVar20);
      }
      sVar23 = (size_t)phVar16->truncate;
      if (sVar23 == 0) {
        sVar23 = phVar16->outsize;
      }
      lVar8 = EVP_MAC_fetch(0,"CMAC",0);
      if (lVar8 == 0) goto LAB_00104826;
      lVar14 = EVP_MAC_CTX_new(lVar8);
      if (lVar14 == 0) goto LAB_0010484d;
      uStack_160 = "cipher";
      uStack_158 = 4;
      pcStack_148 = (char *)0x0;
      pcStack_140 = (char *)0xffffffffffffffff;
      uStack_118 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      pcStack_150 = pcVar20;
      iVar1 = EVP_MAC_CTX_set_params(lVar14,&uStack_160);
      if (iVar1 == 0) goto LAB_00104874;
      iVar1 = EVP_MAC_init(lVar14,phVar16->key,(long)phVar16->key_size,&uStack_160);
      if (iVar1 == 0) goto LAB_0010489b;
      iVar1 = EVP_MAC_update(lVar14,puStack_248,sVar9);
      if (iVar1 == 0) goto LAB_001047b1;
      iVar1 = EVP_MAC_final(lVar14,apcStack_200,&sStack_258);
      if (iVar1 == 0) goto LAB_001047d8;
      EVP_MAC_CTX_free(lVar14);
      EVP_MAC_free(lVar8);
      if (sStack_258 < sVar23) goto LAB_001047ff;
      pcVar20 = phVar16->digest;
      iVar1 = bcmp(apcStack_200,pcVar20,sVar23);
      bVar24 = iVar1 != 0;
      if (bVar24) {
        printf("\x1b[1;31mcmac mismatch (iter %d)\x1b[m\n",uVar22 & 0xffffffff);
        hexdump(pcVar20,sVar23);
        hexdump(apcStack_200,sStack_258);
      }
    }
    else {
      bVar24 = false;
      if (iVar1 == 0x4a8) {
        pcVar20 = "magma-cbc";
        goto LAB_00104015;
      }
    }
    if (bVar24 || uVar2 != 0) {
      uVar2 = 1;
      goto LAB_00104522;
    }
    bVar24 = 0x1e < uVar22;
    uVar22 = uVar22 + 1;
    uStack_220 = (ulong)bVar24;
  } while (uVar22 != 0x20);
  uVar2 = 0;
LAB_00104522:
  CRYPTO_free(pvStack_230);
  EVP_MAC_free(lStack_270);
  EVP_MD_free(pEStack_280);
  pcVar20 = "\x1b[1;31mfail\x1b[m";
  if ((uStack_220 & 1) != 0) {
    pcVar20 = "\x1b[1;32msuccess\x1b[m";
  }
  puts(pcVar20);
  uStack_238 = uStack_238 | uVar2;
  goto LAB_00104603;
LAB_00104715:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(ctx, ibuf + shifts, len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x349);
LAB_0010473c:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinal(ctx, md, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x34a);
LAB_00104763:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(ctx2, md, mdlen)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x34b);
LAB_0010478a:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestInit(ctx, dgst)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x348);
  goto LAB_001047b1;
code_r0x001044dc:
  CRYPTO_free(pcStack_240);
  pvVar15 = (void *)((long)pvStack_230 + 1);
  lStack_270 = lStack_270 + 1;
  phVar16 = phStack_250;
  if (pvVar15 == (void *)0x10) goto code_r0x00104511;
  goto LAB_001041f7;
code_r0x00104511:
  pcVar20 = "\x1b[1;32msuccess\x1b[m";
LAB_001045fe:
  phVar16 = phStack_250;
  puts(pcVar20);
LAB_00104603:
  pcStack_278 = phVar16[1].algname;
  phVar16 = phVar16 + 1;
  if (pcStack_278 == (char *)0x0) {
    warn_all_untested();
    pcVar20 = "\x1b[0;31m= Some tests FAILED!\x1b[m";
    if (uStack_238 == 0) {
      pcVar20 = "\x1b[0;32m= All tests passed!\x1b[m";
    }
    puts(pcVar20);
    return;
  }
  goto LAB_001037f4;
LAB_001047b1:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26d);
LAB_001047d8:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26e);
LAB_001047ff:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("outsize <= len",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x274);
LAB_00104826:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("cmac = EVP_MAC_fetch(NULL, \"CMAC\", NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x264);
LAB_0010484d:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MAC_CTX_new(cmac)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x266);
LAB_00104874:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_set_params(ctx, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26b);
LAB_0010489b:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x26c);
LAB_001048c2:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x290);
LAB_001048e9:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2ab);
LAB_00104910:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x29d);
LAB_00104937:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_set_params(ctx, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x29c);
LAB_0010495e:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x29b);
LAB_00104985:
  OPENSSL_die("assertion failed: mdlen == tv->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x339);
LAB_0010499d:
  OPENSSL_die("assertion failed: EVP_MD_block_size(dgst) == tv->block_size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x334);
LAB_001049b5:
  OPENSSL_die("assertion failed: EVP_MD_is_a(dgst, tv->algname)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x32e);
LAB_001049cd:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MD_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x330);
LAB_001049f4:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestInit(ctx2, dgst)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x332);
LAB_00104a1b:
  OPENSSL_die("assertion failed: EVP_MD_is_a(EVP_MD_CTX_md(ctx2), tv->algname)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x333);
LAB_00104a33:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("md = OPENSSL_zalloc(mdlen + shifts)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x33a);
LAB_00104a5a:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ibuf = OPENSSL_zalloc(SUPER_SIZE + shifts)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x324);
LAB_00104a81:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx2 = EVP_MD_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x331);
LAB_00104aa8:
  OPENSSL_die("assertion failed: EVP_MD_CTX_size(ctx2) == tv->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x335);
LAB_00104ac0:
  OPENSSL_die("assertion failed: EVP_MD_CTX_block_size(ctx2) == tv->block_size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x336);
LAB_00104ad8:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinal(ctx2, md, &len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x351);
LAB_00104aff:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("hmac = EVP_MAC_fetch(NULL, \"HMAC\", NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x21a);
LAB_00104b26:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MAC_CTX_new(hmac)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x21c);
LAB_00104b4d:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("HMAC_Final(ctx, md, &len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x202);
LAB_00104b74:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("HMAC_Update(ctx, (const unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x201);
LAB_00104b9b:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("HMAC_Init_ex(ctx, t->key, t->key_size, type, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x200);
LAB_00104bc2:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = HMAC_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x1ff);
LAB_00104be9:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_get_mac_size(ctx) == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x292);
LAB_00104c10:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x206);
LAB_00104c37:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x224);
LAB_00104c5e:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("outsize <= sizeof(out)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a2);
LAB_00104c85:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x229);
LAB_00104cac:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x223);
LAB_00104cd3:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_finalXOF(ctx, out, outsize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a3);
LAB_00104cfa:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, params)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x222);
LAB_00104d21:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestUpdate(ctx, plaintext, t->psize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d0);
LAB_00104d48:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("len == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2dd);
LAB_00104d6f:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_CTX_get_mac_size(ctx) == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a6);
LAB_00104d96:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestInit_ex(ctx, type, NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c9);
LAB_00104dbd:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("ctx = EVP_MD_CTX_new()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c7);
LAB_00104de4:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2a7);
LAB_00104e0b:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_init(ctx)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c8);
LAB_00104e32:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("(dgst = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (dgst = EVP_MD_fetch(NULL, tv->algname, NULL))"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x32d);
LAB_00104e59:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_size(type) == t->outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2bd);
LAB_00104e80:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_block_size(type) == t->block_size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2c5);
LAB_00104ea7:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, t->key_size, (void *)t->key)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2cc);
LAB_00104ece:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, t->acpkm, t->acpkm_t? (void *)&t->acpkm_t : NULL)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2cf);
LAB_00104ef5:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinal_ex(ctx, out, &len)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d9);
LAB_00104f1c:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_size(ctx) == outsize",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d8);
LAB_00104f43:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_DigestFinalXOF(ctx, out, outsize)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2d5);
LAB_00104f6a:
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("buf = OPENSSL_malloc(tv->psize + shifts)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2fb);
LAB_00104f91:
  ERR_print_errors_fp(_stderr);
  pcVar19 = 
  "(md = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (md = EVP_MD_fetch(NULL, tv->algname, NULL)) || (mac = EVP_MAC_fetch(NULL, tv->algname, NULL))"
  ;
  pcVar20 = "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c";
  OPENSSL_die("(md = (EVP_MD *)EVP_get_digestbyname(tv->algname)) || (md = EVP_MD_fetch(NULL, tv->algname, NULL)) || (mac = EVP_MAC_fetch(NULL, tv->algname, NULL))"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
              ,0x2f2);
  if (pcVar20 != (char *)0x0) {
    pcVar17 = (char *)0x0;
    do {
      lVar8 = 0;
      do {
        if (pcVar20 <= pcVar17 + lVar8) goto LAB_00105022;
        pcVar18 = "";
        if (lVar8 == 0) {
          pcVar18 = " ";
        }
        printf("%s%02x",pcVar18,(ulong)(byte)(pcVar19 + (long)pcVar17)[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      lVar8 = 0x10;
LAB_00105022:
      pcVar17 = pcVar17 + lVar8;
    } while (pcVar17 < pcVar20);
  }
  putchar(10);
  return;
}

Assistant:

void warn_all_untested(void)
{
    if (engine_is_available("gost")) {
        ENGINE *eng;

        T(eng = ENGINE_by_id("gost"));
        T(ENGINE_init(eng));

        ENGINE_DIGESTS_PTR fn_c;
        T(fn_c = ENGINE_get_digests(eng));
        const int *nids;
        int n, k;
        n = fn_c(eng, NULL, &nids, 0);
        for (k = 0; k < n; ++k)
            warn_if_untested(ENGINE_get_digest(eng, nids[k]), NULL);
        ENGINE_finish(eng);
        ENGINE_free(eng);
    }
    if (OSSL_PROVIDER_available(NULL, "gostprov")) {
        OSSL_PROVIDER *prov;

        T(prov = OSSL_PROVIDER_load(NULL, "gostprov"));
        EVP_MD_do_all_provided(NULL,
                               (void (*)(EVP_MD *, void *))warn_if_untested,
                               prov);

        OSSL_PROVIDER_unload(prov);
    }
}